

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::~vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
          *this)

{
  clear(this);
  pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_int>>>::
  deallocate_object<pstd::optional<std::pair<pbrt::LightHandle,unsigned_int>>>
            ((polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_int>>> *)
             this,this->ptr,this->nAlloc);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }